

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O1

void __thiscall blc::math::Float::Float(Float *this,double i,int E)

{
  int iVar1;
  double dVar2;
  
  (this->super_serializable)._vptr_serializable = (_func_int **)&PTR_serialize_abi_cxx11__0011aa38;
  this->_nb = i;
  this->_E = E;
  if ((i != 0.0) || (NAN(i))) {
    dVar2 = this->_nb;
    if (ABS(i) <= 1.0) {
      if (ABS(dVar2) < 1.0) {
        iVar1 = this->_E;
        do {
          iVar1 = iVar1 + -1;
          dVar2 = dVar2 * 10.0;
        } while (ABS(dVar2) < 1.0);
        goto LAB_0010ccc0;
      }
    }
    else if (10.0 <= ABS(dVar2)) {
      iVar1 = this->_E;
      do {
        iVar1 = iVar1 + 1;
        dVar2 = dVar2 / 10.0;
      } while (10.0 <= ABS(dVar2));
LAB_0010ccc0:
      this->_E = iVar1;
      this->_nb = dVar2;
      return;
    }
  }
  return;
}

Assistant:

blc::math::Float::Float(double i, int E) : _nb(i), _E(E) {
	if (this->_nb == 0)
		return;
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}